

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void nivalis::anon_unknown_1::buf_add_screen_rectangle
               (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                *draw_buf,View *render_view,float x,float y,float w,float h,bool fill,color *c,
               float thickness,size_t rel_func)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  initializer_list<std::array<double,_2UL>_> __l;
  bool bVar7;
  size_type sVar8;
  reference pvVar9;
  reference this;
  color *in_RCX;
  byte in_DL;
  int *in_RSI;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *in_RDI;
  undefined8 in_R8;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  undefined4 in_XMM4_Da;
  value_type *last_rect;
  size_t i;
  double ydiff;
  double xdiff;
  DrawBufferObject rect;
  value_type *in_stack_fffffffffffffe28;
  DrawBufferObject *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  DrawBufferObject *in_stack_fffffffffffffe40;
  value_type_conflict2 vVar10;
  iterator in_stack_fffffffffffffe48;
  size_type in_stack_fffffffffffffe50;
  ulong local_118;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double *local_d0;
  undefined8 local_c8;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_c0;
  undefined4 local_a8;
  undefined8 local_70;
  int local_48;
  undefined8 local_40;
  undefined4 local_34;
  color *local_30;
  byte local_21;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  int *local_10;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *local_8;
  
  local_21 = in_DL & 1;
  if (in_XMM2_Da <= 0.0) {
    return;
  }
  if (in_XMM3_Da <= 0.0) {
    return;
  }
  local_40 = in_R8;
  local_34 = in_XMM4_Da;
  local_30 = in_RCX;
  local_20 = in_XMM3_Da;
  local_1c = in_XMM2_Da;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  DrawBufferObject::DrawBufferObject(in_stack_fffffffffffffe40);
  local_48 = (local_21 & 1) + 3;
  local_f0 = (double)local_14;
  local_e8 = (double)local_18;
  local_e0 = (double)(local_14 + local_1c);
  local_d8 = (double)(local_18 + local_20);
  local_d0 = &local_f0;
  local_c8 = 2;
  __l._M_len = in_stack_fffffffffffffe50;
  __l._M_array = in_stack_fffffffffffffe48;
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
            (&in_stack_fffffffffffffe40->points,__l);
  local_a8 = local_34;
  local_70 = local_40;
  dVar5 = *(double *)(local_10 + 2) - *(double *)(local_10 + 4);
  dVar6 = *(double *)(local_10 + 6) - *(double *)(local_10 + 8);
  for (local_118 = 0;
      sVar8 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size
                        (&local_c0), local_118 < sVar8; local_118 = local_118 + 1) {
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (&local_c0,local_118);
    pvVar9 = std::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    dVar1 = *pvVar9;
    iVar3 = *local_10;
    dVar2 = *(double *)(local_10 + 4);
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (&local_c0,local_118);
    pvVar9 = std::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    *pvVar9 = ((dVar1 * 1.0) / (double)iVar3) * dVar5 + dVar2;
    iVar3 = local_10[1];
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (&local_c0,local_118);
    pvVar9 = std::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    dVar1 = *pvVar9;
    iVar4 = local_10[1];
    dVar2 = *(double *)(local_10 + 8);
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (&local_c0,local_118);
    pvVar9 = std::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                        (size_type)in_stack_fffffffffffffe28);
    *pvVar9 = ((((double)iVar3 - dVar1) * 1.0) / (double)iVar4) * dVar6 + dVar2;
  }
  if (((local_21 & 1) != 0) &&
     (sVar8 = std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
              size(local_8), sVar8 != 0)) {
    this = std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::back
                     ((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                       *)in_stack_fffffffffffffe30);
    if (this->type == FILLED_RECT) {
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (&this->points,0);
      pvVar9 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                          (size_type)in_stack_fffffffffffffe28);
      dVar1 = *pvVar9;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (&local_c0,0);
      pvVar9 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                          (size_type)in_stack_fffffffffffffe28);
      if (ABS(dVar1 - *pvVar9) < dVar6 * 1e-06) {
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this->points,1);
        pvVar9 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                            (size_type)in_stack_fffffffffffffe28);
        dVar1 = *pvVar9;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&local_c0,1);
        pvVar9 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                            (size_type)in_stack_fffffffffffffe28);
        if (ABS(dVar1 - *pvVar9) < dVar6 * 1e-06) {
          std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
          operator[](&this->points,1);
          pvVar9 = std::array<double,_2UL>::operator[]
                             ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                              (size_type)in_stack_fffffffffffffe28);
          dVar1 = *pvVar9;
          std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
          operator[](&local_c0,0);
          pvVar9 = std::array<double,_2UL>::operator[]
                             ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                              (size_type)in_stack_fffffffffffffe28);
          if ((ABS(dVar1 - *pvVar9) < dVar5 * 1e-06) &&
             (bVar7 = color::color::operator==(&this->c,local_30), bVar7)) {
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
            operator[](&local_c0,1);
            pvVar9 = std::array<double,_2UL>::operator[]
                               ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                                (size_type)in_stack_fffffffffffffe28);
            vVar10 = *pvVar9;
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
            operator[](&this->points,1);
            pvVar9 = std::array<double,_2UL>::operator[]
                               ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                                (size_type)in_stack_fffffffffffffe28);
            *pvVar9 = vVar10;
            goto LAB_0018231f;
          }
        }
      }
    }
    if (this->type == FILLED_RECT) {
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (&this->points,0);
      pvVar9 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                          (size_type)in_stack_fffffffffffffe28);
      vVar10 = *pvVar9;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (&local_c0,0);
      pvVar9 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                          (size_type)in_stack_fffffffffffffe28);
      if (ABS(vVar10 - *pvVar9) < dVar5 * 1e-06) {
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this->points,1);
        pvVar9 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                            (size_type)in_stack_fffffffffffffe28);
        vVar10 = *pvVar9;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&local_c0,1);
        pvVar9 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                            (size_type)in_stack_fffffffffffffe28);
        if (ABS(vVar10 - *pvVar9) < dVar5 * 1e-06) {
          std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
          operator[](&this->points,1);
          pvVar9 = std::array<double,_2UL>::operator[]
                             ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                              (size_type)in_stack_fffffffffffffe28);
          vVar10 = *pvVar9;
          std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
          operator[](&local_c0,0);
          pvVar9 = std::array<double,_2UL>::operator[]
                             ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                              (size_type)in_stack_fffffffffffffe28);
          if ((ABS(vVar10 - *pvVar9) < dVar6 * 1e-06) &&
             (in_stack_fffffffffffffe3f = color::color::operator==(&this->c,local_30),
             (bool)in_stack_fffffffffffffe3f)) {
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
            operator[](&local_c0,1);
            pvVar9 = std::array<double,_2UL>::operator[]
                               ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                                (size_type)in_stack_fffffffffffffe28);
            in_stack_fffffffffffffe30 = (DrawBufferObject *)*pvVar9;
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
            operator[](&this->points,1);
            pvVar9 = std::array<double,_2UL>::operator[]
                               ((array<double,_2UL> *)in_stack_fffffffffffffe30,
                                (size_type)in_stack_fffffffffffffe28);
            *pvVar9 = (value_type_conflict2)in_stack_fffffffffffffe30;
            goto LAB_0018231f;
          }
        }
      }
    }
  }
  color::color::operator=
            ((color *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (color *)in_stack_fffffffffffffe30);
  std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::push_back
            ((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
LAB_0018231f:
  DrawBufferObject::~DrawBufferObject(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void buf_add_screen_rectangle(
        std::vector<DrawBufferObject>& draw_buf,
        const Plotter::View& render_view,
        float x, float y, float w, float h, bool fill, const color::color& c,
        float thickness, size_t rel_func) {
    if (w <= 0. || h <= 0.) return;
    DrawBufferObject rect;
    rect.type = fill ? DrawBufferObject::FILLED_RECT : DrawBufferObject::RECT;
    rect.points = {{(double)x, (double)y}, {(double)(x+w), (double)(y+h)}};
    rect.thickness = thickness,
    rect.rel_func = rel_func;
    auto xdiff = render_view.xmax - render_view.xmin;
    auto ydiff = render_view.ymax - render_view.ymin;
    for (size_t i = 0; i < rect.points.size(); ++i) {
        rect.points[i][0] = rect.points[i][0]*1. /
            render_view.swid * xdiff + render_view.xmin;
        rect.points[i][1] = (render_view.shigh - rect.points[i][1])*1. /
            render_view.shigh * ydiff + render_view.ymin;
    }
    if (fill && draw_buf.size()) {
        auto& last_rect = draw_buf.back();
        if (last_rect.type == DrawBufferObject::FILLED_RECT &&
                std::fabs(last_rect.points[0][1] - rect.points[0][1]) < 1e-6 * ydiff &&
                std::fabs(last_rect.points[1][1] - rect.points[1][1]) < 1e-6 * ydiff &&
                std::fabs(last_rect.points[1][0] - rect.points[0][0]) < 1e-6 * xdiff &&
                last_rect.c == c) {
            // Reduce shape count by merging with rectangle to left
            last_rect.points[1][0] = rect.points[1][0];
            return;
        } else if (last_rect.type == DrawBufferObject::FILLED_RECT &&
                std::fabs(last_rect.points[0][0] - rect.points[0][0]) < 1e-6 * xdiff &&
                std::fabs(last_rect.points[1][0] - rect.points[1][0]) < 1e-6 * xdiff &&
                std::fabs(last_rect.points[1][1] - rect.points[0][1]) < 1e-6 * ydiff &&
                last_rect.c == c) {
            // Reduce shape count by merging with rectangle above
            last_rect.points[1][1] = rect.points[1][1];
            return;
        }
    }
    rect.c = c;
    draw_buf.push_back(std::move(rect));
}